

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functional.hpp
# Opt level: O0

result_type
boost::numeric::ublas::
vector_inner_prod<boost::numeric::ublas::vector_binary<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>const>,boost::numeric::ublas::matrix_column<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>const>,boost::numeric::ublas::scalar_multiplies<double,double>>,boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>,double>
::
apply<boost::numeric::ublas::vector_binary<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>const>,boost::numeric::ublas::matrix_column<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>const>,boost::numeric::ublas::scalar_multiplies<double,double>>,boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>>
          (vector_expression<boost::numeric::ublas::vector_binary<boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::matrix_column<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>_>
           *e1,vector_expression<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
               *e2)

{
  size_type sVar1;
  const_reference pdVar2;
  vector_expression<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
  *in_RSI;
  vector_expression<boost::numeric::ublas::vector_binary<boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::matrix_column<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>_>
  *in_RDI;
  matrix_row<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  *this;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  vector_size_type i;
  result_type t;
  vector_size_type size;
  size_type in_stack_ffffffffffffffc8;
  ulong i_00;
  vector_binary<boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::matrix_column<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>
  *this_00;
  
  vector_expression<boost::numeric::ublas::vector_binary<boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::matrix_column<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>_>
  ::operator()(in_RDI);
  sVar1 = vector_binary<boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::matrix_column<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>
          ::size((vector_binary<boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::matrix_column<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>
                  *)0x918450);
  this_00 = (vector_binary<boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::matrix_column<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>
             *)0x0;
  for (i_00 = 0; i_00 < sVar1; i_00 = i_00 + 1) {
    vector_expression<boost::numeric::ublas::vector_binary<boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::matrix_column<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>_>
    ::operator()(in_RDI);
    this = (matrix_row<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
            *)vector_binary<boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::matrix_column<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>
              ::operator()(this_00,i_00);
    vector_expression<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
    ::operator()(in_RSI);
    pdVar2 = matrix_row<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
             ::operator()(this,in_stack_ffffffffffffffc8);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = this;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = *pdVar2;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = this_00;
    auVar3 = vfmadd213sd_fma(auVar3,auVar4,auVar5);
    this_00 = auVar3._0_8_;
  }
  return (result_type)this_00;
}

Assistant:

static BOOST_UBLAS_INLINE
        result_type apply (const vector_expression<E1> &e1,
                           const vector_expression<E2> &e2) {
            typedef typename E1::size_type vector_size_type;
            vector_size_type size (BOOST_UBLAS_SAME (e1 ().size (), e2 ().size ()));
            result_type t = result_type (0);
#ifndef BOOST_UBLAS_USE_DUFF_DEVICE
            for (vector_size_type i = 0; i < size; ++ i)
                t += e1 () (i) * e2 () (i);
#else
            vector_size_type i (0);
            DD (size, 4, r, (t += e1 () (i) * e2 () (i), ++ i));
#endif
            return t;
        }